

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SyncPointVk::SyncPointVk
          (SyncPointVk *this,SoftwareQueueIndex CommandQueueId,Uint32 NumContexts,
          VulkanSyncObjectManager *SyncObjectMngr,VkDevice LogicalDevice,Uint64 dbgValue)

{
  bool bVar1;
  Uint32 UVar2;
  Char *pCVar3;
  NativeType fence;
  char *pcVar4;
  NativeType semaphore;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *local_2e0;
  string local_2c8;
  string local_2a8;
  string local_288;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  uint local_17c;
  undefined1 local_178 [4];
  Uint32 s_1;
  string local_158;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  String Name;
  undefined1 local_88 [4];
  Uint32 s;
  string msg_1;
  string msg;
  Uint64 dbgValue_local;
  VkDevice LogicalDevice_local;
  VulkanSyncObjectManager *SyncObjectMngr_local;
  Uint32 NumContexts_local;
  SyncPointVk *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  this_local._7_1_ = CommandQueueId.m_Value;
  std::enable_shared_from_this<Diligent::SyncPointVk>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Diligent::SyncPointVk>);
  (this->m_CommandQueueId).m_Value = this_local._7_1_;
  SyncObjectMngr_local._4_1_ = (Uint8)NumContexts;
  this->m_NumSemaphores = SyncObjectMngr_local._4_1_;
  VulkanUtilities::VulkanSyncObjectManager::CreateFence(&this->m_Fence,SyncObjectMngr);
  local_2e0 = this->m_Semaphores;
  do {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    RecycledSyncObject(local_2e0);
    local_2e0 = local_2e0 + 1;
  } while ((SyncPointVk *)local_2e0 != this + 1);
  bVar1 = IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag>::operator==
                    (&this->m_CommandQueueId,
                     (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                     ((long)&this_local + 7));
  if (!bVar1) {
    FormatString<char[45]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [45])"Not enough bits to store command queue index");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5a);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if (this->m_NumSemaphores != NumContexts) {
    FormatString<char[45]>
              ((string *)local_88,(char (*) [45])"Not enough bits to store command queue count");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5b);
    std::__cxx11::string::~string((string *)local_88);
  }
  for (Name.field_2._12_4_ = 1; (uint)Name.field_2._12_4_ < NumContexts;
      Name.field_2._12_4_ = Name.field_2._12_4_ + 1) {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    RecycledSyncObject(this->m_Semaphores + (uint)Name.field_2._12_4_);
  }
  if (1 < NumContexts) {
    VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
              (SyncObjectMngr,this->m_Semaphores,NumContexts - 1);
    UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
    std::
    swap<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
              (this->m_Semaphores + UVar2,this->m_Semaphores + (NumContexts - 1));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"Queue (",&local_131);
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  std::__cxx11::to_string(&local_158,UVar2);
  std::operator+(&local_110,&local_130,&local_158);
  std::operator+(&local_f0,&local_110,") Value (");
  std::__cxx11::to_string((string *)local_178,dbgValue);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_d0,")");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  fence = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::operator_cast_to_VkFence_T_
                    ((RecycledSyncObject *)&this->m_Fence);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  VulkanUtilities::SetFenceName(LogicalDevice,fence,pcVar4);
  for (local_17c = 0; local_17c < this->m_NumSemaphores; local_17c = local_17c + 1) {
    bVar1 = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::operator_cast_to_bool
                      ((RecycledSyncObject *)(this->m_Semaphores + local_17c));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_260,"Queue (",&local_261);
      UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
      std::__cxx11::to_string(&local_288,UVar2);
      std::operator+(&local_240,&local_260,&local_288);
      std::operator+(&local_220,&local_240,") Value (");
      std::__cxx11::to_string(&local_2a8,dbgValue);
      std::operator+(&local_200,&local_220,&local_2a8);
      std::operator+(&local_1e0,&local_200,") Ctx (");
      std::__cxx11::to_string(&local_2c8,local_17c);
      std::operator+(&local_1c0,&local_1e0,&local_2c8);
      std::operator+(&local_1a0,&local_1c0,")");
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      semaphore = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::
                  operator_cast_to_VkSemaphore_T_
                            ((RecycledSyncObject *)(this->m_Semaphores + local_17c));
      pcVar4 = (char *)std::__cxx11::string::c_str();
      VulkanUtilities::SetSemaphoreName(LogicalDevice,semaphore,pcVar4);
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

SyncPointVk::SyncPointVk(SoftwareQueueIndex                        CommandQueueId,
                         Uint32                                    NumContexts,
                         VulkanUtilities::VulkanSyncObjectManager& SyncObjectMngr,
                         VkDevice                                  LogicalDevice,
                         Uint64                                    dbgValue) :
    m_CommandQueueId{CommandQueueId},
    m_NumSemaphores{static_cast<Uint8>(NumContexts)},
    m_Fence{SyncObjectMngr.CreateFence()}
{
    VERIFY(m_CommandQueueId == CommandQueueId, "Not enough bits to store command queue index");
    VERIFY(m_NumSemaphores == NumContexts, "Not enough bits to store command queue count");

    // Call constructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < NumContexts; ++s)
        new (&m_Semaphores[s]) VulkanUtilities::VulkanRecycledSemaphore{};

    // Semaphores are used to synchronize between queues; they are not used for synchronization within one queue.
    if (NumContexts > 1)
    {
        SyncObjectMngr.CreateSemaphores(m_Semaphores, NumContexts - 1);

        // Semaphore for the current queue is not used.
        std::swap(m_Semaphores[CommandQueueId], m_Semaphores[NumContexts - 1]);
    }

#ifdef DILIGENT_DEBUG
    String Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ")";
    VulkanUtilities::SetFenceName(LogicalDevice, m_Fence, Name.c_str());

    for (Uint32 s = 0; s < m_NumSemaphores; ++s)
    {
        if (m_Semaphores[s])
        {
            Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ") Ctx (" + std::to_string(s) + ")";
            VulkanUtilities::SetSemaphoreName(LogicalDevice, m_Semaphores[s], Name.c_str());
        }
    }
#endif
}